

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.c
# Opt level: O3

_Bool arm_cpu_exec_interrupt_aarch64(CPUState *cs,int interrupt_request)

{
  CPUARMState_conflict *env;
  ulong uVar1;
  CPUClass *pCVar2;
  void *pvVar3;
  uint32_t uVar4;
  uint64_t uVar5;
  int32_t iVar6;
  uint uVar7;
  _Bool secure;
  
  env = (CPUARMState_conflict *)cs->env_ptr;
  uVar1 = env->features;
  if (((uint)uVar1 >> 9 & 1) == 0) {
    if (env->aarch64 == 0) {
      uVar7 = env->uncached_cpsr & 0x1f;
      if (uVar7 == 0x10) {
        uVar7 = 0;
      }
      else if (uVar7 == 0x16) {
LAB_00609ae1:
        uVar7 = 3;
      }
      else if (uVar7 == 0x1a) {
        uVar7 = 2;
      }
      else {
        if ((uVar1 & 0x200000000) != 0) {
          if (uVar7 == 0x16) {
            uVar7 = 3;
            if (((uint)uVar1 >> 0x1c & 1) == 0) goto LAB_00609ae7;
          }
          else if ((uVar1 & 0x10000000) == 0 && ((env->cp15).scr_el3 & 1) == 0) goto LAB_00609ae1;
        }
        uVar7 = 1;
      }
    }
    else {
      uVar7 = env->pstate >> 2 & 3;
    }
  }
  else {
    uVar7 = 1;
    if ((env->v7m).exception == 0) {
      uVar7 = ~(env->v7m).control[(env->v7m).secure] & 1;
    }
  }
LAB_00609ae7:
  if ((uVar1 & 0x200000000) == 0) {
    secure = false;
  }
  else if (env->aarch64 == 0) {
    secure = true;
    if ((env->uncached_cpsr & 0x1f) != 0x16) goto LAB_00609b0f;
  }
  else {
    secure = true;
    if ((~env->pstate & 0xc) != 0) {
LAB_00609b0f:
      secure = ((env->cp15).scr_el3 & 1) == 0;
    }
  }
  pCVar2 = cs->cc;
  uVar5 = arm_hcr_el2_eff_aarch64(env);
  if ((interrupt_request & 0x10U) != 0) {
    uVar4 = arm_phys_excp_target_el_aarch64(cs,6,uVar7,secure);
    if (uVar7 <= uVar4) {
      pvVar3 = cs->env_ptr;
      if (uVar4 != 1 && uVar7 < uVar4) {
        if ((*(byte *)((long)pvVar3 + 0x3033) & 0x10) == 0) {
          if ((*(ulong *)((long)pvVar3 + 0x3c0) & 4) == 0) {
            if ((uVar5 & 8) != 0) {
LAB_00609be4:
              iVar6 = 6;
              if (secure == false) goto LAB_00609cf6;
            }
          }
          else if (((uVar5 & 8) != 0) || ((*(ulong *)((long)pvVar3 + 0x3c0) & 0x10) == 0))
          goto LAB_00609be4;
        }
        else {
          iVar6 = 6;
          if ((uVar4 == 3) || (secure != true)) goto LAB_00609cf6;
        }
      }
      iVar6 = 6;
      if ((*(ulong *)((long)pvVar3 + 0x230) & 0x40) == 0) goto LAB_00609cf6;
    }
  }
  if ((interrupt_request & 2U) != 0) {
    uVar4 = arm_phys_excp_target_el_aarch64(cs,5,uVar7,secure);
    if (uVar7 <= uVar4) {
      uVar1 = *(ulong *)((long)cs->env_ptr + 0x230);
      if (uVar4 == 1 || uVar4 <= uVar7) {
LAB_00609c4b:
        iVar6 = 5;
        if (-1 < (char)uVar1) goto LAB_00609cf6;
      }
      else {
        if ((*(byte *)((long)cs->env_ptr + 0x3033) & 0x10) == 0) {
          if ((uVar5 & 0x10) == 0) goto LAB_00609c4b;
          iVar6 = 5;
          if (secure == false) goto LAB_00609cf6;
        }
        else {
          iVar6 = 5;
          if ((uVar4 == 3) || (secure != true)) goto LAB_00609cf6;
        }
        iVar6 = 5;
        if ((uVar1 & 0x80) == 0) goto LAB_00609cf6;
      }
    }
  }
  if (((((interrupt_request & 0x40U) == 0) || (1 < uVar7)) ||
      (((uint)uVar5 & 0x8000010) != 0x10 || secure != false)) ||
     ((*(byte *)((long)cs->env_ptr + 0x230) & 0x80) != 0)) {
    if (((((uint)interrupt_request >> 9 & 1) == 0) || (1 < uVar7)) ||
       ((secure != false || ((uint)uVar5 & 0x8000008) != 8 ||
        ((*(byte *)((long)cs->env_ptr + 0x230) & 0x40) != 0)))) {
      return false;
    }
    iVar6 = 0xf;
  }
  else {
    iVar6 = 0xe;
  }
  uVar4 = 1;
LAB_00609cf6:
  cs->exception_index = iVar6;
  (env->exception).target_el = uVar4;
  (*pCVar2->do_interrupt)((CPUState_conflict *)cs);
  return true;
}

Assistant:

bool arm_cpu_exec_interrupt(CPUState *cs, int interrupt_request)
{
    CPUClass *cc = CPU_GET_CLASS(cs);
    CPUARMState *env = cs->env_ptr;
    uint32_t cur_el = arm_current_el(env);
    bool secure = arm_is_secure(env);
    uint64_t hcr_el2 = arm_hcr_el2_eff(env);
    uint32_t target_el;
    uint32_t excp_idx;

    /* The prioritization of interrupts is IMPLEMENTATION DEFINED. */

    if (interrupt_request & CPU_INTERRUPT_FIQ) {
        excp_idx = EXCP_FIQ;
        target_el = arm_phys_excp_target_el(cs, excp_idx, cur_el, secure);
        if (arm_excp_unmasked(cs, excp_idx, target_el,
                              cur_el, secure, hcr_el2)) {
            goto found;
        }
    }
    if (interrupt_request & CPU_INTERRUPT_HARD) {
        excp_idx = EXCP_IRQ;
        target_el = arm_phys_excp_target_el(cs, excp_idx, cur_el, secure);
        if (arm_excp_unmasked(cs, excp_idx, target_el,
                              cur_el, secure, hcr_el2)) {
            goto found;
        }
    }
    if (interrupt_request & CPU_INTERRUPT_VIRQ) {
        excp_idx = EXCP_VIRQ;
        target_el = 1;
        if (arm_excp_unmasked(cs, excp_idx, target_el,
                              cur_el, secure, hcr_el2)) {
            goto found;
        }
    }
    if (interrupt_request & CPU_INTERRUPT_VFIQ) {
        excp_idx = EXCP_VFIQ;
        target_el = 1;
        if (arm_excp_unmasked(cs, excp_idx, target_el,
                              cur_el, secure, hcr_el2)) {
            goto found;
        }
    }
    return false;

 found:
    cs->exception_index = excp_idx;
    env->exception.target_el = target_el;
    cc->do_interrupt(cs);
    return true;
}